

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<unsigned_long,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<unsigned_long,_8UL>::operator=
          (SmallVector<unsigned_long,_8UL> *this,SmallVector<unsigned_long,_8UL> *other)

{
  unsigned_long *puVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  (this->super_VectorView<unsigned_long>).buffer_size = 0;
  puVar3 = (other->super_VectorView<unsigned_long>).ptr;
  if ((AlignedBuffer<unsigned_long,_8UL> *)puVar3 == &other->stack_storage) {
    reserve(this,(other->super_VectorView<unsigned_long>).buffer_size);
    if ((other->super_VectorView<unsigned_long>).buffer_size == 0) {
      uVar5 = 0;
    }
    else {
      puVar3 = (this->super_VectorView<unsigned_long>).ptr;
      puVar1 = (other->super_VectorView<unsigned_long>).ptr;
      uVar4 = 0;
      do {
        puVar3[uVar4] = puVar1[uVar4];
        uVar4 = uVar4 + 1;
        uVar5 = (other->super_VectorView<unsigned_long>).buffer_size;
      } while (uVar4 < uVar5);
    }
    (this->super_VectorView<unsigned_long>).buffer_size = uVar5;
    (other->super_VectorView<unsigned_long>).buffer_size = 0;
  }
  else {
    puVar1 = (this->super_VectorView<unsigned_long>).ptr;
    if ((AlignedBuffer<unsigned_long,_8UL> *)puVar1 != &this->stack_storage) {
      free(puVar1);
      puVar3 = (other->super_VectorView<unsigned_long>).ptr;
    }
    (this->super_VectorView<unsigned_long>).ptr = puVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<unsigned_long>).buffer_size =
         (other->super_VectorView<unsigned_long>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<unsigned_long>).ptr = (unsigned_long *)0x0;
    (other->super_VectorView<unsigned_long>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}